

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

ssize_t ossl_send(connectdata *conn,int sockindex,void *mem,size_t len,CURLcode *curlcode)

{
  Curl_easy *pCVar1;
  int iVar2;
  ulong errcode;
  char *pcVar3;
  uint *puVar4;
  int local_1dc;
  char local_1d8 [8];
  char ver [120];
  ssl_connect_data *connssl;
  int rc;
  int memlen;
  unsigned_long sslerror;
  char error_buffer [256];
  int err;
  CURLcode *curlcode_local;
  size_t len_local;
  void *mem_local;
  int sockindex_local;
  connectdata *conn_local;
  
  ver._112_8_ = conn->ssl + sockindex;
  ERR_clear_error();
  if (len < 0x80000000) {
    local_1dc = (int)len;
  }
  else {
    local_1dc = 0x7fffffff;
  }
  iVar2 = SSL_write(*(SSL **)(*(long *)(ver._112_8_ + 0x10) + 8),mem,local_1dc);
  if (0 < iVar2) {
    *curlcode = CURLE_OK;
    return (long)iVar2;
  }
  iVar2 = SSL_get_error(*(SSL **)(*(long *)(ver._112_8_ + 0x10) + 8),iVar2);
  if (iVar2 == 1) {
    errcode = ERR_get_error();
    iVar2 = ERR_GET_LIB(errcode);
    if ((((iVar2 == 0x14) && (iVar2 = ERR_GET_REASON(errcode), iVar2 == 0x80)) &&
        (conn->ssl[sockindex].state == ssl_connection_complete)) &&
       (conn->proxy_ssl[sockindex].state == ssl_connection_complete)) {
      Curl_ossl_version(local_1d8,0x78);
      Curl_failf(conn->data,"Error: %s does not support double SSL tunneling.",local_1d8);
    }
    else {
      pCVar1 = conn->data;
      pcVar3 = ossl_strerror(errcode,(char *)&sslerror,0x100);
      Curl_failf(pCVar1,"SSL_write() error: %s",pcVar3);
    }
    *curlcode = CURLE_SEND_ERROR;
    return -1;
  }
  if (1 < iVar2 - 2U) {
    if (iVar2 != 5) {
      pCVar1 = conn->data;
      pcVar3 = SSL_ERROR_to_str(iVar2);
      puVar4 = (uint *)__errno_location();
      Curl_failf(pCVar1,"OpenSSL SSL_write: %s, errno %d",pcVar3,(ulong)*puVar4);
      *curlcode = CURLE_SEND_ERROR;
      return -1;
    }
    pCVar1 = conn->data;
    puVar4 = (uint *)__errno_location();
    Curl_failf(pCVar1,"SSL_write() returned SYSCALL, errno = %d",(ulong)*puVar4);
    *curlcode = CURLE_SEND_ERROR;
    return -1;
  }
  *curlcode = CURLE_AGAIN;
  return -1;
}

Assistant:

static ssize_t ossl_send(struct connectdata *conn,
                         int sockindex,
                         const void *mem,
                         size_t len,
                         CURLcode *curlcode)
{
  /* SSL_write() is said to return 'int' while write() and send() returns
     'size_t' */
  int err;
  char error_buffer[256];
  unsigned long sslerror;
  int memlen;
  int rc;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];

  ERR_clear_error();

  memlen = (len > (size_t)INT_MAX) ? INT_MAX : (int)len;
  rc = SSL_write(BACKEND->handle, mem, memlen);

  if(rc <= 0) {
    err = SSL_get_error(BACKEND->handle, rc);

    switch(err) {
    case SSL_ERROR_WANT_READ:
    case SSL_ERROR_WANT_WRITE:
      /* The operation did not complete; the same TLS/SSL I/O function
         should be called again later. This is basically an EWOULDBLOCK
         equivalent. */
      *curlcode = CURLE_AGAIN;
      return -1;
    case SSL_ERROR_SYSCALL:
      failf(conn->data, "SSL_write() returned SYSCALL, errno = %d",
            SOCKERRNO);
      *curlcode = CURLE_SEND_ERROR;
      return -1;
    case SSL_ERROR_SSL:
      /*  A failure in the SSL library occurred, usually a protocol error.
          The OpenSSL error queue contains more information on the error. */
      sslerror = ERR_get_error();
      if(ERR_GET_LIB(sslerror) == ERR_LIB_SSL &&
         ERR_GET_REASON(sslerror) == SSL_R_BIO_NOT_SET &&
         conn->ssl[sockindex].state == ssl_connection_complete &&
         conn->proxy_ssl[sockindex].state == ssl_connection_complete) {
        char ver[120];
        Curl_ossl_version(ver, 120);
        failf(conn->data, "Error: %s does not support double SSL tunneling.",
              ver);
      }
      else
        failf(conn->data, "SSL_write() error: %s",
              ossl_strerror(sslerror, error_buffer, sizeof(error_buffer)));
      *curlcode = CURLE_SEND_ERROR;
      return -1;
    }
    /* a true error */
    failf(conn->data, OSSL_PACKAGE " SSL_write: %s, errno %d",
          SSL_ERROR_to_str(err), SOCKERRNO);
    *curlcode = CURLE_SEND_ERROR;
    return -1;
  }
  *curlcode = CURLE_OK;
  return (ssize_t)rc; /* number of bytes */
}